

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexReader.cpp
# Opt level: O3

PtexFaceData * __thiscall
Ptex::v2_2::PtexReader::TiledReducedFace::getTile(TiledReducedFace *this,int tile)

{
  size_t *psVar1;
  Res RVar2;
  DataType DVar3;
  _func_int *p_Var4;
  code *pcVar5;
  long lVar6;
  long lVar7;
  pointer ppFVar8;
  ReduceFn *pRVar9;
  TiledReducedFace *pTVar10;
  char cVar11;
  int iVar12;
  undefined4 extraout_var;
  void *pvVar14;
  void *__s2;
  FaceData *pFVar15;
  _func_int **pp_Var16;
  byte bVar17;
  TiledFaceBase *pTVar18;
  int iVar19;
  int iVar20;
  uint uVar21;
  int i;
  ulong uVar22;
  uint uVar23;
  int iVar24;
  bool bVar25;
  undefined8 uStack_a0;
  DataType aDStack_98 [2];
  ulong uStack_90;
  FaceData *local_88;
  ulong local_80;
  long local_78;
  pointer local_70;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  ReduceFn *local_58;
  undefined8 *local_50;
  TiledReducedFace *local_48;
  uint local_40;
  int local_3c;
  int local_38;
  uint local_34;
  long *plVar13;
  
  local_78 = (long)tile;
  local_70 = (this->super_TiledFaceBase)._tiles.
             super__Vector_base<Ptex::v2_2::PtexReader::FaceData_*,_std::allocator<Ptex::v2_2::PtexReader::FaceData_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  if (local_70[local_78] != (FaceData *)0x0) {
    return &local_70[local_78]->super_PtexFaceData;
  }
  pTVar18 = this->_parentface;
  iVar12 = pTVar18->_ntilesu;
  iVar24 = (this->super_TiledFaceBase)._ntilesu;
  iVar20 = iVar12 / iVar24;
  local_3c = pTVar18->_ntilesv / (this->super_TiledFaceBase)._ntilesv;
  uVar21 = local_3c * iVar20;
  lVar6 = -((long)(int)uVar21 * 8 + 0xfU & 0xfffffffffffffff0);
  local_50 = (undefined8 *)((long)&local_88 + lVar6);
  if (0 < (int)uVar21) {
    uVar23 = (tile % iVar24) * iVar20 + (tile / iVar24) * local_3c * iVar12;
    local_48 = (TiledReducedFace *)CONCAT44(local_48._4_4_,(iVar12 - iVar20) + 1);
    local_80 = (ulong)uVar21;
    bVar25 = true;
    uVar22 = 0;
    local_38 = iVar20;
    local_34 = uVar21;
    do {
      p_Var4 = (pTVar18->super_FaceData).super_PtexFaceData._vptr_PtexFaceData[9];
      *(undefined8 *)((long)&uStack_90 + lVar6) = 0x11136a;
      iVar12 = (*p_Var4)(pTVar18,(ulong)uVar23);
      plVar13 = (long *)CONCAT44(extraout_var,iVar12);
      local_50[uVar22] = plVar13;
      if (bVar25) {
        pcVar5 = *(code **)(*plVar13 + 0x18);
        *(undefined8 *)((long)&uStack_90 + lVar6) = 0x111384;
        cVar11 = (*pcVar5)(plVar13);
        if (cVar11 == '\0') goto LAB_001113bd;
        if (uVar22 != 0) {
          pcVar5 = *(code **)(*(long *)*local_50 + 0x30);
          *(undefined8 *)((long)&uStack_90 + lVar6) = 0x11139a;
          pvVar14 = (void *)(*pcVar5)();
          pcVar5 = *(code **)(*plVar13 + 0x30);
          *(undefined8 *)((long)&uStack_90 + lVar6) = 0x1113a6;
          __s2 = (void *)(*pcVar5)(plVar13);
          iVar12 = (this->super_TiledFaceBase)._pixelsize;
          *(undefined8 *)((long)&uStack_90 + lVar6) = 0x1113b5;
          iVar12 = bcmp(pvVar14,__s2,(long)iVar12);
          bVar25 = iVar12 == 0;
          goto LAB_001113c0;
        }
        iVar12 = (int)local_48;
        if ((int)(1 % (long)local_38) != 0) {
          iVar12 = 1;
        }
        if (local_34 == 1) break;
        bVar25 = true;
        uVar22 = 1;
      }
      else {
LAB_001113bd:
        bVar25 = false;
LAB_001113c0:
        uVar22 = uVar22 + 1;
        iVar12 = (int)local_48;
        if ((int)((long)((ulong)(uint)((int)uVar22 >> 0x1f) << 0x20 | uVar22 & 0xffffffff) %
                 (long)local_38) != 0) {
          iVar12 = 1;
        }
        if (uVar22 == local_80) goto LAB_0011140f;
      }
      uVar23 = uVar23 + iVar12;
      pTVar18 = this->_parentface;
    } while( true );
  }
LAB_00111414:
  *(undefined8 *)((long)&uStack_90 + lVar6) = 0x11141e;
  pFVar15 = (FaceData *)operator_new(0x18);
  iVar20 = (this->super_TiledFaceBase)._pixelsize;
  (pFVar15->_res).ulog2 = '\0';
  (pFVar15->_res).vlog2 = '\0';
  (pFVar15->super_PtexFaceData)._vptr_PtexFaceData = (_func_int **)&PTR__PackedFace_00126600;
  *(int *)&pFVar15->field_0xc = iVar20;
  *(undefined8 *)((long)&uStack_90 + lVar6) = 0x111443;
  pp_Var16 = (_func_int **)operator_new__((long)iVar20);
  pFVar15[1].super_PtexFaceData._vptr_PtexFaceData = pp_Var16;
  (pFVar15->super_PtexFaceData)._vptr_PtexFaceData = (_func_int **)&PTR__PackedFace_00126680;
  pcVar5 = *(code **)(*(long *)*local_50 + 0x30);
  *(undefined8 *)((long)&uStack_90 + lVar6) = 0x111463;
  pvVar14 = (void *)(*pcVar5)();
  iVar12 = (this->super_TiledFaceBase)._pixelsize;
  *(undefined8 *)((long)&uStack_90 + lVar6) = 0x111472;
  memcpy(pp_Var16,pvVar14,(long)iVar12);
LAB_00111618:
  ppFVar8 = local_70;
  lVar7 = local_78;
  LOCK();
  bVar25 = local_70[local_78] == (FaceData *)0x0;
  if (bVar25) {
    local_70[local_78] = pFVar15;
  }
  UNLOCK();
  if (bVar25) {
    if ((long)iVar20 + 0x18 != 0) {
      LOCK();
      psVar1 = &((this->super_TiledFaceBase)._reader)->_memUsed;
      *psVar1 = *psVar1 + (long)iVar20 + 0x18;
      UNLOCK();
    }
  }
  else {
    p_Var4 = (pFVar15->super_PtexFaceData)._vptr_PtexFaceData[1];
    *(undefined8 *)((long)&uStack_90 + lVar6) = 0x111643;
    (*p_Var4)(pFVar15);
  }
  return &ppFVar8[lVar7]->super_PtexFaceData;
LAB_0011140f:
  if (!bVar25) {
    iVar12 = (this->super_TiledFaceBase)._pixelsize;
    bVar17 = (this->super_TiledFaceBase)._tileres.vlog2;
    local_40 = (uint)bVar17;
    iVar24 = ((1 << ((this->super_TiledFaceBase)._tileres.ulog2 & 0x1fU)) << (bVar17 & 0x1f)) *
             iVar12;
    *(undefined8 *)((long)&uStack_90 + lVar6) = 0x1114ad;
    pFVar15 = (FaceData *)operator_new(0x18);
    RVar2 = (this->super_TiledFaceBase)._tileres;
    local_58 = (ReduceFn *)CONCAT44(local_58._4_4_,(uint)(ushort)RVar2);
    pFVar15->_res = RVar2;
    (pFVar15->super_PtexFaceData)._vptr_PtexFaceData = (_func_int **)&PTR__PackedFace_00126600;
    *(int *)&pFVar15->field_0xc = iVar12;
    local_5c = iVar24;
    local_34 = iVar12;
    *(undefined8 *)((long)&uStack_90 + lVar6) = 0x1114da;
    pp_Var16 = (_func_int **)operator_new__((long)iVar24);
    pFVar15[1].super_PtexFaceData._vptr_PtexFaceData = pp_Var16;
    RVar2 = this->_parentface->_tileres;
    bVar17 = RVar2.ulog2;
    local_64 = 1 << (bVar17 & 0x1f);
    local_68 = 1 << (RVar2.vlog2 & 0x1fU);
    local_60 = local_34 << (bVar17 & 0x1f);
    iVar24 = local_34 << ((byte)local_58 & 0x1f);
    local_34 = iVar24 / local_38;
    local_40 = (iVar24 << ((byte)local_40 & 0x1f)) / local_3c - (local_38 + -1) * local_34;
    uVar22 = 0;
    iVar12 = local_38;
    local_88 = pFVar15;
    local_48 = this;
    do {
      plVar13 = (long *)local_50[uVar22];
      pcVar5 = *(code **)(*plVar13 + 0x18);
      *(undefined8 *)((long)&uStack_90 + lVar6) = 0x111559;
      cVar11 = (*pcVar5)(plVar13);
      pTVar10 = local_48;
      if (cVar11 == '\0') {
        local_58 = local_48->_reducefn;
        pcVar5 = *(code **)(*plVar13 + 0x30);
        *(undefined8 *)((long)&uStack_90 + lVar6) = 0x1115b9;
        pvVar14 = (void *)(*pcVar5)(plVar13);
        iVar19 = local_60;
        iVar20 = local_64;
        iVar12 = local_68;
        DVar3 = (pTVar10->super_TiledFaceBase)._dt;
        *(ulong *)((long)&uStack_90 + lVar6) = (ulong)(uint)(pTVar10->super_TiledFaceBase)._nchan;
        *(ulong *)((long)aDStack_98 + lVar6) = (ulong)DVar3;
        pRVar9 = local_58;
        *(undefined8 *)((long)&uStack_a0 + lVar6) = 0x1115da;
        (*pRVar9)(pvVar14,iVar19,iVar20,iVar12,pp_Var16,iVar24,
                  *(DataType *)((long)aDStack_98 + lVar6),*(int *)((long)&uStack_90 + lVar6));
        iVar12 = local_38;
      }
      else {
        pcVar5 = *(code **)(*plVar13 + 0x30);
        *(undefined8 *)((long)&uStack_90 + lVar6) = 0x111566;
        pvVar14 = (void *)(*pcVar5)(plVar13);
        bVar17 = (local_48->super_TiledFaceBase)._tileres.ulog2;
        iVar19 = (1 << ((local_48->super_TiledFaceBase)._tileres.vlog2 & 0x1fU)) / local_3c;
        iVar20 = (local_48->super_TiledFaceBase)._pixelsize;
        *(undefined8 *)((long)&uStack_90 + lVar6) = 0x1115a2;
        PtexUtils::fill(pvVar14,pp_Var16,iVar24,(1 << (bVar17 & 0x1f)) / iVar12,iVar19,iVar20);
      }
      uVar22 = uVar22 + 1;
      uVar21 = local_34;
      if ((int)((long)((ulong)(uint)((int)uVar22 >> 0x1f) << 0x20 | uVar22 & 0xffffffff) %
               (long)iVar12) == 0) {
        uVar21 = local_40;
      }
      pp_Var16 = (_func_int **)((long)pp_Var16 + (long)(int)uVar21);
      this = local_48;
      pFVar15 = local_88;
      iVar20 = local_5c;
    } while (local_80 != uVar22);
    goto LAB_00111618;
  }
  goto LAB_00111414;
}

Assistant:

PtexFaceData* PtexReader::TiledReducedFace::getTile(int tile)
{
    FaceData*& face = _tiles[tile];
    if (face) {
        return face;
    }

    // first, get all parent tiles for this tile
    // and check if they are constant (with the same value)
    int pntilesu = _parentface->ntilesu();
    int pntilesv = _parentface->ntilesv();
    int nu = pntilesu / _ntilesu; // num parent tiles for this tile in u dir
    int nv = pntilesv / _ntilesv; // num parent tiles for this tile in v dir

    int ntilesval = nu*nv; // num parent tiles for this tile
    PtexFaceData** tiles = (PtexFaceData**) alloca(ntilesval * sizeof(PtexFaceData*));
    bool allConstant = true;
    int ptile = (tile/_ntilesu) * nv * pntilesu + (tile%_ntilesu) * nu;
    for (int i = 0; i < ntilesval;) {
        PtexFaceData* tileval = tiles[i] = _parentface->getTile(ptile);
        allConstant = (allConstant && tileval->isConstant() &&
                       (i==0 || (0 == memcmp(tiles[0]->getData(), tileval->getData(),
                                             _pixelsize))));
        i++;
        ptile += (i%nu)? 1 : pntilesu - nu + 1;
    }

    FaceData* newface = 0;
    size_t newMemUsed = 0;
    if (allConstant) {
        // allocate a new constant face
        newface = new ConstantFace(_pixelsize);
        newMemUsed = sizeof(ConstantFace) + _pixelsize;
        memcpy(newface->getData(), tiles[0]->getData(), _pixelsize);
    }
    else {
        // allocate a new packed face for the tile
        int memsize = _pixelsize*_tileres.size();
        newface = new PackedFace(_tileres, _pixelsize, memsize);
        newMemUsed = sizeof(PackedFace) + memsize;

        // generate reduction from parent tiles
        int ptileures = _parentface->tileres().u();
        int ptilevres = _parentface->tileres().v();
        int sstride = ptileures * _pixelsize;
        int dstride = _tileres.u() * _pixelsize;
        int dstepu = dstride/nu;
        int dstepv = dstride*_tileres.v()/nv - dstepu*(nu-1);

        char* dst = (char*) newface->getData();
        for (int i = 0; i < ntilesval;) {
            PtexFaceData* tileval = tiles[i];
            if (tileval->isConstant())
                PtexUtils::fill(tileval->getData(), dst, dstride,
                                _tileres.u()/nu, _tileres.v()/nv,
                                _pixelsize);
            else
                _reducefn(tileval->getData(), sstride, ptileures, ptilevres,
                          dst, dstride, _dt, _nchan);
            i++;
            dst += (i%nu) ? dstepu : dstepv;
        }
    }

    if (!AtomicCompareAndSwap(&face, (FaceData*)0, newface)) {
        delete newface;
    }
    else {
        _reader->increaseMemUsed(newMemUsed);
    }

    return face;
}